

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O2

void __thiscall
Args::HelpHasBeenPrintedException::HelpHasBeenPrintedException(HelpHasBeenPrintedException *this)

{
  allocator local_31;
  String local_30;
  
  std::__cxx11::string::string((string *)&local_30,"Help has been printed.",&local_31);
  BaseException::BaseException(&this->super_BaseException,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_BaseException = &PTR__BaseException_0014aa00;
  return;
}

Assistant:

HelpHasBeenPrintedException()
		:	BaseException( SL( "Help has been printed." ) )
	{
	}